

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O3

int __thiscall deqp::egl::ReusableSyncTests::init(ReusableSyncTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestCaseGroup *pTVar1;
  SyncTest *pSVar2;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"valid","Valid function calls");
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "create_null_attribs","create_null_attribs");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_021196b8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "create_empty_attribs","create_empty_attribs");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119758;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "wait_no_timeout","wait_no_timeout");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_021197a8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "wait_forever","wait_forever");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_021197f8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "wait_no_context","wait_no_Context");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119848;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "wait_forever_flush","wait_forever_flush");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119898;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,"get_type",
             "get_type");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_021198e8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "get_status","get_status");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119938;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "get_status_signaled","get_status_signaled");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119988;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,"destroy",
             "destroy");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119a28;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_WAIT_SYNC,true,
             "wait_server","wait_server");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119a78;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"invalid","Invalid function calls");
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "create_invalid_display","create_invalid_display");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119ac8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "create_invalid_type","create_invalid_type");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119b18;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "create_invalid_attribs","create_invalid_attribs");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119b68;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "wait_invalid_display","wait_invalid_display");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119c08;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "wait_invalid_sync","wait_invalid_sync");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119c58;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "get_invalid_display","get_invalid_display");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119ca8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "get_invalid_sync","get_invalid_sync");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119cf8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "get_invalid_attribute","get_invalid_attribute");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119d48;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "get_invalid_value","get_invalid_value");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119d98;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "destroy_invalid_display","destroy_invalid_display");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119de8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_NONE,false,
             "destroy_invalid_sync","destroy_invalid_sync");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119e38;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_WAIT_SYNC,true,
             "wait_server_invalid_display","wait_server_invalid_display");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119e88;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_WAIT_SYNC,true,
             "wait_server_invalid_sync","wait_server_invalid_sync");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119ed8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa,EXTENSION_WAIT_SYNC,true,
             "wait_server_invalid_flag","wait_server_invalid_flag");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02119f28;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void ReusableSyncTests::init (void)
{
	// Add valid API test
	{
		TestCaseGroup* const valid = new TestCaseGroup(m_eglTestCtx, "valid", "Valid function calls");

		// eglCreateSyncKHR tests
		valid->addChild(new CreateNullAttribsTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		valid->addChild(new CreateEmptyAttribsTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglClientWaitSyncKHR tests
		valid->addChild(new ClientWaitNoTimeoutTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		valid->addChild(new ClientWaitForeverTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		valid->addChild(new ClientWaitNoContextTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		valid->addChild(new ClientWaitForeverFlushTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglGetSyncAttribKHR tests
		valid->addChild(new GetSyncTypeTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		valid->addChild(new GetSyncStatusTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		valid->addChild(new GetSyncStatusSignaledTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglDestroySyncKHR tests
		valid->addChild(new DestroySyncTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglWaitSyncKHR tests
		valid->addChild(new WaitSyncTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		addChild(valid);
	}

	// Add negative API tests
	{
		TestCaseGroup* const invalid = new TestCaseGroup(m_eglTestCtx, "invalid", "Invalid function calls");

		// eglCreateSyncKHR tests
		invalid->addChild(new CreateInvalidDisplayTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new CreateInvalidTypeTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new CreateInvalidAttribsTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglClientWaitSyncKHR tests
		invalid->addChild(new ClientWaitInvalidDisplayTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new ClientWaitInvalidSyncTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglGetSyncAttribKHR tests
		invalid->addChild(new GetSyncInvalidDisplayTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new GetSyncInvalidSyncTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new GetSyncInvalidAttributeTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new GetSyncInvalidValueTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglDestroySyncKHR tests
		invalid->addChild(new DestroySyncInvalidDislayTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new DestroySyncInvalidSyncTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglWaitSyncKHR tests
		invalid->addChild(new WaitSyncInvalidDisplayTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new WaitSyncInvalidSyncTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new WaitSyncInvalidFlagTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		addChild(invalid);
	}
}